

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_amount.cpp
# Opt level: O1

void __thiscall
Amount_ArithmeticOperatorsTest_Test::~Amount_ArithmeticOperatorsTest_Test
          (Amount_ArithmeticOperatorsTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Amount, ArithmeticOperatorsTest) {
  int64_t base_satoshi_val = 12345;
  Amount base_amt = Amount::CreateBySatoshiAmount(base_satoshi_val);
  // arithmetic operators
  Amount rh_amt = Amount::CreateBySatoshiAmount(1);
  // addition
  EXPECT_EQ((base_satoshi_val + 1), (base_amt + 1));
  EXPECT_EQ((base_satoshi_val + 1), (base_amt + rh_amt));
  EXPECT_EQ((1 + base_satoshi_val), (1 + base_amt));
  // subtraction
  EXPECT_EQ((base_satoshi_val - 1), (base_amt - 1));
  EXPECT_EQ((base_satoshi_val - 1), (base_amt - rh_amt));
  EXPECT_EQ((123456 - base_satoshi_val), (123456 - base_amt));
  // multiplication
  EXPECT_EQ((base_satoshi_val * 2), (base_amt * 2));
  EXPECT_EQ((2 * base_satoshi_val), (2 * base_amt));
  // division
  EXPECT_EQ((base_satoshi_val / 5), (base_amt / 5));

  // assignment operators
  // addition assignment
  EXPECT_EQ((base_satoshi_val += 1), (base_amt += 1));
  EXPECT_EQ((base_satoshi_val += 1), (base_amt += rh_amt));
  // subtraction assignment
  EXPECT_EQ((base_satoshi_val -= 1), (base_amt -= 1));
  EXPECT_EQ((base_satoshi_val -= 1), (base_amt -= rh_amt));
  // multiplication assignment
  EXPECT_EQ((base_satoshi_val *= 2), (base_amt *= 2));
  // division assignment
  EXPECT_EQ((base_satoshi_val /= 2), (base_amt /= 2));
}